

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O1

int tx_to_bytes(wally_tx *tx,tx_serialize_opts *opts,uint32_t flags,uchar *bytes_out,size_t len,
               size_t *written,_Bool is_elements)

{
  wally_tx_input *pwVar1;
  wally_tx_witness_stack *pwVar2;
  wally_tx_witness_item *pwVar3;
  wally_tx_output *pwVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  bool bVar8;
  byte bVar9;
  _Bool _Var10;
  leint32_t tmp;
  int iVar11;
  undefined4 uVar12;
  uint uVar13;
  size_t sVar14;
  size_t sVar15;
  uint uVar16;
  ulong uVar17;
  uint32_t *puVar18;
  size_t *written_00;
  uchar *puVar19;
  uchar *puVar20;
  uint32_t *bytes_out_00;
  long lVar21;
  size_t sVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  size_t n;
  size_t witness_count;
  ulong local_48;
  size_t *local_40;
  size_t local_38;
  
  if (opts == (tx_serialize_opts *)0x0) {
    bVar9 = 0;
    bVar23 = true;
    bVar24 = false;
    bVar25 = false;
  }
  else {
    bVar9 = (byte)opts->sighash >> 7;
    bVar23 = (opts->sighash & 0x40) == 0;
    bVar24 = (opts->sighash & 0x1f) == 2;
    bVar25 = (opts->sighash & 0x1f) == 3;
  }
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  written_00 = written;
  _Var10 = is_valid_tx(tx);
  if ((_Var10) && ((bytes_out != (uchar *)0x0 && written != (size_t *)0x0) && flags < 0x10)) {
    sVar22 = (size_t)is_elements;
    iVar11 = tx_get_length(tx,opts,flags,&local_48,is_elements);
    if (iVar11 == 0) {
      if ((opts != (tx_serialize_opts *)0x0 & (byte)flags) != 0) {
        return -1;
      }
      if (((flags & 4) != 0) || ((tx->num_inputs != 0 && (tx->num_outputs != 0)))) {
        if (tx->num_inputs == 0) {
          if (flags < 8) {
            return -2;
          }
          flags = 0;
        }
        if (len < local_48) {
          *written = local_48;
        }
        else {
          if ((opts != (tx_serialize_opts *)0x0) && (opts->bip143 == true)) {
            iVar11 = tx_to_bip143_bytes(tx,opts,(uint32_t)bytes_out,(uchar *)written,sVar22,
                                        written_00);
            return iVar11;
          }
          if ((flags & 1) != 0) {
            iVar11 = wally_tx_get_witness_count(tx,&local_38);
            if (iVar11 != 0) {
              return -2;
            }
            if (local_38 == 0) {
              flags = 0;
            }
          }
          *(uint32_t *)bytes_out = tx->version;
          puVar19 = bytes_out + 4;
          if (is_elements) {
            if (opts == (tx_serialize_opts *)0x0) {
              bytes_out[4] = (byte)flags & 1;
              puVar19 = bytes_out + 5;
            }
          }
          else if ((flags & 1) != 0) {
            bytes_out[4] = '\0';
            bytes_out[5] = '\x01';
            puVar19 = bytes_out + 6;
          }
          if (bVar9 == 0) {
            sVar22 = varint_to_bytes(tx->num_inputs,puVar19);
            puVar19 = puVar19 + sVar22;
          }
          else {
            *puVar19 = '\x01';
            puVar19 = puVar19 + 1;
          }
          local_40 = written;
          if (tx->num_inputs != 0) {
            lVar21 = 0xa0;
            sVar22 = 0;
            do {
              pwVar1 = tx->inputs;
              if ((bVar9 == 0) || (uVar13 = 0, sVar22 == opts->index)) {
                uVar5 = *(undefined8 *)((long)pwVar1 + lVar21 + -0xa0);
                uVar6 = *(undefined8 *)((long)pwVar1 + lVar21 + -0x98);
                uVar7 = *(undefined8 *)((long)pwVar1 + lVar21 + -0x88);
                *(undefined8 *)(puVar19 + 0x10) = *(undefined8 *)((long)pwVar1 + lVar21 + -0x90);
                *(undefined8 *)(puVar19 + 0x18) = uVar7;
                *(undefined8 *)puVar19 = uVar5;
                *(undefined8 *)(puVar19 + 8) = uVar6;
                if (opts == (tx_serialize_opts *)0x0) {
                  if ((pwVar1->txhash[lVar21 + -0x60] & 2) == 0) {
                    if ((pwVar1->txhash[lVar21 + -0x60] & 4) == 0) goto LAB_003be3e5;
                    uVar13 = *(uint *)(pwVar1->txhash + lVar21 + -0x80);
                    uVar16 = 0x40000000;
                  }
                  else {
                    uVar13 = *(uint *)(pwVar1->txhash + lVar21 + -0x80);
                    uVar16 = 0x80000000;
                  }
                  uVar13 = uVar13 | uVar16;
                }
                else {
LAB_003be3e5:
                  uVar13 = *(uint *)(pwVar1->txhash + lVar21 + -0x80);
                }
                *(uint *)(puVar19 + 0x20) = uVar13;
                if (opts == (tx_serialize_opts *)0x0) {
                  puVar20 = *(uchar **)(pwVar1->txhash + lVar21 + -0x78);
                  sVar14 = *(size_t *)(pwVar1->txhash + lVar21 + -0x70);
LAB_003be438:
                  sVar14 = varbuff_to_bytes(puVar20,sVar14,puVar19 + 0x24);
                  puVar20 = puVar19 + 0x24 + sVar14;
                }
                else {
                  if (sVar22 == opts->index) {
                    puVar20 = opts->script;
                    sVar14 = opts->script_len;
                    goto LAB_003be438;
                  }
                  puVar19[0x24] = '\0';
                  puVar20 = puVar19 + 0x25;
                }
                if ((!(bool)(bVar24 | bVar25)) || (uVar12 = 0, sVar22 == opts->index)) {
                  uVar12 = *(undefined4 *)(pwVar1->txhash + lVar21 + -0x7c);
                }
                *(undefined4 *)puVar20 = uVar12;
                puVar19 = puVar20 + 4;
                if ((pwVar1->txhash[lVar21 + -0x60] & 2) == 0 || !is_elements) {
                  uVar13 = (pwVar1->txhash[lVar21 + -0x60] & 2) >> 1;
                }
                else {
                  uVar5 = *(undefined8 *)(pwVar1->txhash + lVar21 + -0x5f);
                  uVar6 = *(undefined8 *)(pwVar1->txhash + lVar21 + -0x5f + 8);
                  uVar7 = *(undefined8 *)(pwVar1->txhash + lVar21 + -0x4f + 8);
                  *(undefined8 *)(puVar20 + 0x14) = *(undefined8 *)(pwVar1->txhash + lVar21 + -0x4f)
                  ;
                  *(undefined8 *)(puVar20 + 0x1c) = uVar7;
                  *(undefined8 *)puVar19 = uVar5;
                  *(undefined8 *)(puVar20 + 0xc) = uVar6;
                  uVar5 = *(undefined8 *)(pwVar1->txhash + lVar21 + -0x3f);
                  uVar6 = *(undefined8 *)(pwVar1->txhash + lVar21 + -0x3f + 8);
                  uVar7 = *(undefined8 *)(pwVar1->txhash + lVar21 + -0x2f + 8);
                  *(undefined8 *)(puVar20 + 0x34) = *(undefined8 *)(pwVar1->txhash + lVar21 + -0x2f)
                  ;
                  *(undefined8 *)(puVar20 + 0x3c) = uVar7;
                  *(undefined8 *)(puVar20 + 0x24) = uVar5;
                  *(undefined8 *)(puVar20 + 0x2c) = uVar6;
                  sVar14 = confidential_value_to_bytes
                                     (*(uchar **)(pwVar1->txhash + lVar21 + -0x18),
                                      *(size_t *)(pwVar1->txhash + lVar21 + -0x10),puVar20 + 0x44);
                  sVar15 = confidential_value_to_bytes
                                     (*(uchar **)(pwVar1->txhash + lVar21 + -8),
                                      *(size_t *)(pwVar1->txhash + lVar21),puVar20 + sVar14 + 0x44);
                  puVar19 = puVar20 + sVar14 + 0x44 + sVar15;
                  uVar13 = 0;
                }
              }
              if (uVar13 != 0) {
                return -2;
              }
              sVar22 = sVar22 + 1;
              lVar21 = lVar21 + 0xd0;
            } while (sVar22 < tx->num_inputs);
          }
          if (bVar24) {
            *puVar19 = '\0';
            puVar18 = (uint32_t *)(puVar19 + 1);
          }
          else {
            if (bVar25) {
              sVar22 = opts->index + 1;
            }
            else {
              sVar22 = tx->num_outputs;
            }
            sVar14 = varint_to_bytes(sVar22,puVar19);
            puVar18 = (uint32_t *)(puVar19 + sVar14);
            bVar24 = sVar22 != 0;
            if (bVar24) {
              lVar21 = 0x68;
              uVar17 = 0;
              do {
                pwVar4 = tx->outputs;
                if ((bVar25) && (uVar17 != opts->index)) {
                  *(undefined1 *)(puVar18 + 2) = 0;
                  puVar18[0] = 0xffffffff;
                  puVar18[1] = 0xffffffff;
                  puVar18 = (uint32_t *)((long)puVar18 + 9);
                  bVar8 = true;
                }
                else {
                  if ((*(byte *)((long)pwVar4 + lVar21 + -0x50) & 1) == 0) {
                    *(undefined8 *)puVar18 = *(undefined8 *)((long)pwVar4 + lVar21 + -0x68);
                    puVar18 = puVar18 + 2;
                  }
                  else {
                    if (!is_elements) {
                      bVar8 = false;
                      goto LAB_003be690;
                    }
                    sVar14 = confidential_value_to_bytes
                                       (*(uchar **)((long)pwVar4 + lVar21 + -0x48),
                                        *(size_t *)((long)pwVar4 + lVar21 + -0x40),(uchar *)puVar18)
                    ;
                    sVar15 = confidential_value_to_bytes
                                       (*(uchar **)((long)pwVar4 + lVar21 + -0x38),
                                        *(size_t *)((long)pwVar4 + lVar21 + -0x30),
                                        (uchar *)(sVar14 + (long)puVar18));
                    puVar19 = (uchar *)(sVar14 + (long)puVar18) + sVar15;
                    sVar14 = confidential_value_to_bytes
                                       (*(uchar **)((long)pwVar4 + lVar21 + -0x28),
                                        *(size_t *)((long)pwVar4 + lVar21 + -0x20),puVar19);
                    puVar18 = (uint32_t *)(puVar19 + sVar14);
                  }
                  sVar14 = varbuff_to_bytes(*(uchar **)((long)pwVar4 + lVar21 + -0x60),
                                            *(size_t *)((long)pwVar4 + lVar21 + -0x58),
                                            (uchar *)puVar18);
                  puVar18 = (uint32_t *)(sVar14 + (long)puVar18);
                  bVar8 = true;
                  if (is_elements && !bVar23) {
                    sVar14 = varbuff_to_bytes(*(uchar **)((long)pwVar4 + lVar21 + -8),
                                              *(size_t *)((long)&pwVar4->satoshi + lVar21),
                                              (uchar *)puVar18);
                    sVar15 = varbuff_to_bytes(*(uchar **)((long)pwVar4 + lVar21 + -0x18),
                                              *(size_t *)((long)pwVar4 + lVar21 + -0x10),
                                              (uchar *)(sVar14 + (long)puVar18));
                    puVar18 = (uint32_t *)((uchar *)(sVar14 + (long)puVar18) + sVar15);
                  }
                }
LAB_003be690:
                if (!bVar8) break;
                uVar17 = uVar17 + 1;
                bVar24 = uVar17 < sVar22;
                lVar21 = lVar21 + 0x70;
              } while (sVar22 != uVar17);
            }
            if (bVar24) {
              return -2;
            }
          }
          if (((flags & 1) != 0 && !is_elements) && (tx->num_inputs != 0)) {
            uVar17 = 0;
            do {
              pwVar1 = tx->inputs;
              pwVar2 = pwVar1[uVar17].witness;
              if (pwVar2 == (wally_tx_witness_stack *)0x0) {
                sVar22 = 0;
              }
              else {
                sVar22 = pwVar2->num_items;
              }
              sVar14 = varint_to_bytes(sVar22,(uchar *)puVar18);
              puVar18 = (uint32_t *)(sVar14 + (long)puVar18);
              if (sVar22 != 0) {
                lVar21 = 8;
                do {
                  pwVar3 = (pwVar1[uVar17].witness)->items;
                  sVar14 = varbuff_to_bytes(*(uchar **)((long)pwVar3 + lVar21 + -8),
                                            *(size_t *)((long)&pwVar3->witness + lVar21),
                                            (uchar *)puVar18);
                  puVar18 = (uint32_t *)((long)puVar18 + sVar14);
                  lVar21 = lVar21 + 0x10;
                  sVar22 = sVar22 - 1;
                } while (sVar22 != 0);
              }
              uVar17 = uVar17 + 1;
            } while (uVar17 < tx->num_inputs);
          }
          bytes_out_00 = puVar18 + 1;
          *puVar18 = tx->locktime;
          if (opts != (tx_serialize_opts *)0x0) {
            *bytes_out_00 = opts->tx_sighash;
          }
          if (is_elements && (flags & 1) != 0) {
            if (tx->num_inputs != 0) {
              uVar17 = 0;
              do {
                pwVar1 = tx->inputs;
                sVar22 = varbuff_to_bytes(pwVar1[uVar17].issuance_amount_rangeproof,
                                          pwVar1[uVar17].issuance_amount_rangeproof_len,
                                          (uchar *)bytes_out_00);
                sVar14 = varbuff_to_bytes(pwVar1[uVar17].inflation_keys_rangeproof,
                                          pwVar1[uVar17].inflation_keys_rangeproof_len,
                                          (uchar *)(sVar22 + (long)bytes_out_00));
                if (pwVar1[uVar17].witness == (wally_tx_witness_stack *)0x0) {
                  sVar15 = 0;
                }
                else {
                  sVar15 = (pwVar1[uVar17].witness)->num_items;
                }
                puVar19 = (uchar *)(sVar22 + (long)bytes_out_00) + sVar14;
                sVar22 = varint_to_bytes(sVar15,puVar19);
                puVar19 = puVar19 + sVar22;
                if (sVar15 != 0) {
                  lVar21 = 8;
                  do {
                    pwVar3 = (pwVar1[uVar17].witness)->items;
                    sVar22 = varbuff_to_bytes(*(uchar **)((long)pwVar3 + lVar21 + -8),
                                              *(size_t *)((long)&pwVar3->witness + lVar21),puVar19);
                    puVar19 = puVar19 + sVar22;
                    lVar21 = lVar21 + 0x10;
                    sVar15 = sVar15 - 1;
                  } while (sVar15 != 0);
                }
                if (pwVar1[uVar17].pegin_witness == (wally_tx_witness_stack *)0x0) {
                  sVar22 = 0;
                }
                else {
                  sVar22 = (pwVar1[uVar17].pegin_witness)->num_items;
                }
                sVar14 = varint_to_bytes(sVar22,puVar19);
                bytes_out_00 = (uint32_t *)(puVar19 + sVar14);
                if (sVar22 != 0) {
                  lVar21 = 8;
                  do {
                    pwVar3 = (pwVar1[uVar17].pegin_witness)->items;
                    sVar14 = varbuff_to_bytes(*(uchar **)((long)pwVar3 + lVar21 + -8),
                                              *(size_t *)((long)&pwVar3->witness + lVar21),
                                              (uchar *)bytes_out_00);
                    bytes_out_00 = (uint32_t *)((long)bytes_out_00 + sVar14);
                    lVar21 = lVar21 + 0x10;
                    sVar22 = sVar22 - 1;
                  } while (sVar22 != 0);
                }
                uVar17 = uVar17 + 1;
              } while (uVar17 < tx->num_inputs);
            }
            if (tx->num_outputs != 0) {
              lVar21 = 0x68;
              uVar17 = 0;
              do {
                pwVar4 = tx->outputs;
                sVar22 = varbuff_to_bytes(*(uchar **)((long)pwVar4 + lVar21 + -0x18),
                                          *(size_t *)((long)pwVar4 + lVar21 + -0x10),
                                          (uchar *)bytes_out_00);
                sVar14 = varbuff_to_bytes(*(uchar **)((long)pwVar4 + lVar21 + -8),
                                          *(size_t *)((long)&pwVar4->satoshi + lVar21),
                                          (uchar *)(sVar22 + (long)bytes_out_00));
                bytes_out_00 = (uint32_t *)((uchar *)(sVar22 + (long)bytes_out_00) + sVar14);
                uVar17 = uVar17 + 1;
                lVar21 = lVar21 + 0x70;
              } while (uVar17 < tx->num_outputs);
            }
          }
          *local_40 = local_48;
        }
        return 0;
      }
    }
  }
  return -2;
}

Assistant:

static int tx_to_bytes(const struct wally_tx *tx,
                       const struct tx_serialize_opts *opts,
                       uint32_t flags,
                       unsigned char *bytes_out, size_t len,
                       size_t *written,
                       bool is_elements)
{
    size_t n, i, j, witness_count;
    const bool anyonecanpay = opts && opts->sighash & WALLY_SIGHASH_ANYONECANPAY;
#ifdef BUILD_ELEMENTS
    const bool sh_rangeproof = opts && opts->sighash & WALLY_SIGHASH_RANGEPROOF;
#endif
    const bool sh_none = opts && (opts->sighash & SIGHASH_MASK) == WALLY_SIGHASH_NONE;
    const bool sh_single = opts && (opts->sighash & SIGHASH_MASK) == WALLY_SIGHASH_SINGLE;
    unsigned char *p = bytes_out;

    if (written)
        *written = 0;

    if (!is_valid_tx(tx) ||
        (flags & ~WALLY_TX_ALL_FLAGS) || !bytes_out || !written ||
        tx_get_length(tx, opts, flags, &n, is_elements) != WALLY_OK)
        return WALLY_EINVAL;

    if (opts && (flags & WALLY_TX_FLAG_USE_WITNESS))
        return WALLY_ERROR; /* Segwit tx hashing is handled elsewhere */

    if (!(flags & WALLY_TX_FLAG_ALLOW_PARTIAL)) {
        /* 0-input/output txs can be only be written with this flag */
        if (!tx->num_inputs || !tx->num_outputs)
            return WALLY_EINVAL;
    }

    if (!tx->num_inputs) {
        /* 0-input txs can only be written in the pre-BIP144 format,
         * since otherwise the resulting tx is ambiguous.
         * Used in PSBTs while building the tx for example.
         */
        if (!(flags & WALLY_TX_FLAG_PRE_BIP144))
            return WALLY_EINVAL;
        flags &= ~WALLY_TX_FLAG_USE_WITNESS;
    }

    if (n > len) {
        *written = n;
        return WALLY_OK;
    }

    if (opts && opts->bip143)
        return tx_to_bip143_bytes(tx, opts, flags, bytes_out, len, written);

    if (flags & WALLY_TX_FLAG_USE_WITNESS) {
        if (wally_tx_get_witness_count(tx, &witness_count) != WALLY_OK)
            return WALLY_EINVAL;
        if (!witness_count)
            flags &= ~WALLY_TX_FLAG_USE_WITNESS;
    }

    p += uint32_to_le_bytes(tx->version, p);
    if (is_elements) {
        if (!opts)
            *p++ = flags & WALLY_TX_FLAG_USE_WITNESS ? 1 : 0;
    } else {
        if (flags & WALLY_TX_FLAG_USE_WITNESS) {
            *p++ = 0; /* Write BIP 144 marker */
            *p++ = 1; /* Write BIP 144 flag */
        }
    }
    if (anyonecanpay)
        *p++ = 1;
    else
        p += varint_to_bytes(tx->num_inputs, p);

    for (i = 0; i < tx->num_inputs; ++i) {
        const struct wally_tx_input *input = tx->inputs + i;
        if (anyonecanpay && i != opts->index)
            continue; /* anyonecanpay only signs the given index */

        memcpy(p, input->txhash, sizeof(input->txhash));
        p += sizeof(input->txhash);
        if (!opts && (input->features & WALLY_TX_IS_ISSUANCE))
            p += uint32_to_le_bytes(input->index | WALLY_TX_ISSUANCE_FLAG, p);
        else if (!opts && (input->features & WALLY_TX_IS_PEGIN))
            p += uint32_to_le_bytes(input->index | WALLY_TX_PEGIN_FLAG, p);
        else
            p += uint32_to_le_bytes(input->index, p);
        if (opts) {
            if (i == opts->index)
                p += varbuff_to_bytes(opts->script, opts->script_len, p);
            else
                *p++ = 0; /* Blank scripts for non-signing inputs */
        } else
            p += varbuff_to_bytes(input->script, input->script_len, p);

        if ((sh_none || sh_single) && i != opts->index)
            p += uint32_to_le_bytes(0, p);
        else
            p += uint32_to_le_bytes(input->sequence, p);
        if (input->features & WALLY_TX_IS_ISSUANCE) {
            if (!is_elements)
                return WALLY_EINVAL;
#ifdef BUILD_ELEMENTS
            memcpy(p, input->blinding_nonce, WALLY_TX_ASSET_TAG_LEN);
            p += WALLY_TX_ASSET_TAG_LEN;
            memcpy(p, input->entropy, WALLY_TX_ASSET_TAG_LEN);
            p += WALLY_TX_ASSET_TAG_LEN;
            p += confidential_value_to_bytes(input->issuance_amount, input->issuance_amount_len, p);
            p += confidential_value_to_bytes(input->inflation_keys, input->inflation_keys_len, p);
#endif
        }
    }

    if (sh_none)
        *p++ = 0;
    else {
        size_t num_outputs = sh_single ? opts->index + 1 : tx->num_outputs;
        p += varint_to_bytes(num_outputs, p);

        for (i = 0; i < num_outputs; ++i) {
            const struct wally_tx_output *output = tx->outputs + i;
            if (sh_single && i != opts->index) {
                memcpy(p, EMPTY_OUTPUT, sizeof(EMPTY_OUTPUT));
                p += sizeof(EMPTY_OUTPUT);
            } else {
                if (output->features & WALLY_TX_IS_ELEMENTS) {
                    if (!is_elements)
                        return WALLY_EINVAL;
#ifdef BUILD_ELEMENTS
                    p += confidential_value_to_bytes(output->asset, output->asset_len, p);
                    p += confidential_value_to_bytes(output->value, output->value_len, p);
                    p += confidential_value_to_bytes(output->nonce, output->nonce_len, p);
#endif
                } else {
                    p += uint64_to_le_bytes(output->satoshi, p);
                }
                p += varbuff_to_bytes(output->script, output->script_len, p);

#ifdef BUILD_ELEMENTS
                if (is_elements && sh_rangeproof) {
                    p += varbuff_to_bytes(output->rangeproof,
                                          output->rangeproof_len, p);
                    p += varbuff_to_bytes(output->surjectionproof,
                                          output->surjectionproof_len, p);
                }
#endif
            }
        }
    }

    if (!is_elements && (flags & WALLY_TX_FLAG_USE_WITNESS)) {
        for (i = 0; i < tx->num_inputs; ++i) {
            const struct wally_tx_input *input = tx->inputs + i;
            size_t num_items = input->witness ? input->witness->num_items : 0;
            p += varint_to_bytes(num_items, p);
            for (j = 0; j < num_items; ++j) {
                const struct wally_tx_witness_item *stack;
                stack = input->witness->items + j;
                p += varbuff_to_bytes(stack->witness, stack->witness_len, p);
            }
        }
    }

    p += uint32_to_le_bytes(tx->locktime, p);
    if (opts)
        uint32_to_le_bytes(opts->tx_sighash, p);

#ifdef BUILD_ELEMENTS
    if (is_elements && (flags & WALLY_TX_FLAG_USE_WITNESS)) {
        for (i = 0; i < tx->num_inputs; ++i) {
            const struct wally_tx_input *input = tx->inputs + i;
            size_t num_items;
            p += varbuff_to_bytes(input->issuance_amount_rangeproof, input->issuance_amount_rangeproof_len, p);
            p += varbuff_to_bytes(input->inflation_keys_rangeproof, input->inflation_keys_rangeproof_len, p);
            num_items = input->witness ? input->witness->num_items : 0;
            p += varint_to_bytes(num_items, p);
            for (j = 0; j < num_items; ++j) {
                const struct wally_tx_witness_item *stack;
                stack = input->witness->items + j;
                p += varbuff_to_bytes(stack->witness, stack->witness_len, p);
            }
            num_items = input->pegin_witness ? input->pegin_witness->num_items : 0;
            p += varint_to_bytes(num_items, p);
            for (j = 0; j < num_items; ++j) {
                const struct wally_tx_witness_item *stack;
                stack = input->pegin_witness->items + j;
                p += varbuff_to_bytes(stack->witness, stack->witness_len, p);
            }
        }
        for (i = 0; i < tx->num_outputs; ++i) {
            const struct wally_tx_output *output = tx->outputs + i;
            p += varbuff_to_bytes(output->surjectionproof, output->surjectionproof_len, p);
            p += varbuff_to_bytes(output->rangeproof, output->rangeproof_len, p);
        }
    }
#endif
    *written = n;
    return WALLY_OK;
}